

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

int F(opt_state_t *opt_state,int code,int v0,int v1)

{
  int iVar1;
  valnode *pvVar2;
  valnode *pvVar3;
  vmapinfo *pvVar4;
  int iVar5;
  uint uVar6;
  
  uVar6 = (uint)(v1 << 8 ^ v0 << 4 ^ code) % 0xd5;
  pvVar2 = opt_state->hashtbl[uVar6];
  pvVar3 = pvVar2;
  while( true ) {
    if (pvVar3 == (valnode *)0x0) {
      iVar1 = opt_state->curval;
      iVar5 = iVar1 + 1;
      opt_state->curval = iVar5;
      if ((code & 0xe6U) == 0) {
        pvVar4 = opt_state->vmap;
        pvVar4[(long)iVar1 + 1].const_val = v0;
        pvVar4[(long)iVar1 + 1].is_const = 1;
      }
      pvVar3 = opt_state->next_vnode;
      opt_state->next_vnode = pvVar3 + 1;
      pvVar3->val = iVar5;
      pvVar3->code = code;
      pvVar3->v0 = v0;
      pvVar3->v1 = v1;
      pvVar3->next = pvVar2;
      opt_state->hashtbl[uVar6] = pvVar3;
      return iVar5;
    }
    if (((pvVar3->code == code) && (pvVar3->v0 == v0)) && (pvVar3->v1 == v1)) break;
    pvVar3 = pvVar3->next;
  }
  return pvVar3->val;
}

Assistant:

static int
F(opt_state_t *opt_state, int code, int v0, int v1)
{
	u_int hash;
	int val;
	struct valnode *p;

	hash = (u_int)code ^ (v0 << 4) ^ (v1 << 8);
	hash %= MODULUS;

	for (p = opt_state->hashtbl[hash]; p; p = p->next)
		if (p->code == code && p->v0 == v0 && p->v1 == v1)
			return p->val;

	val = ++opt_state->curval;
	if (BPF_MODE(code) == BPF_IMM &&
	    (BPF_CLASS(code) == BPF_LD || BPF_CLASS(code) == BPF_LDX)) {
		opt_state->vmap[val].const_val = v0;
		opt_state->vmap[val].is_const = 1;
	}
	p = opt_state->next_vnode++;
	p->val = val;
	p->code = code;
	p->v0 = v0;
	p->v1 = v1;
	p->next = opt_state->hashtbl[hash];
	opt_state->hashtbl[hash] = p;

	return val;
}